

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int decompress_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  jpeg_d_coef_controller *pjVar2;
  inverse_DCT_method_ptr p_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  JBLOCKARRAY ppaJVar7;
  inverse_DCT_method_ptr inverse_DCT;
  jpeg_component_info *compptr;
  JSAMPARRAY ppJStack_58;
  JDIMENSION output_col;
  JSAMPARRAY output_ptr;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer;
  int local_38;
  int block_rows;
  int block_row;
  int ci;
  JDIMENSION block_num;
  JDIMENSION last_iMCU_row;
  my_coef_ptr coef;
  JSAMPIMAGE output_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  while( true ) {
    bVar4 = true;
    if ((cinfo->output_scan_number <= cinfo->input_scan_number) &&
       (bVar4 = false, cinfo->input_scan_number == cinfo->output_scan_number)) {
      bVar4 = cinfo->input_iMCU_row <= cinfo->output_iMCU_row;
    }
    if (!bVar4) break;
    iVar5 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar5 == 0) {
      return 0;
    }
  }
  block_rows = 0;
  inverse_DCT = (inverse_DCT_method_ptr)cinfo->comp_info;
  for (; block_rows < cinfo->num_components; block_rows = block_rows + 1) {
    if (*(int *)(inverse_DCT + 0x34) != 0) {
      ppaJVar7 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)(&pjVar2[3].start_output_pass)[block_rows],
                            cinfo->output_iMCU_row * *(int *)(inverse_DCT + 0xc),
                            *(JDIMENSION *)(inverse_DCT + 0xc),0);
      if (cinfo->output_iMCU_row < JVar1 - 1) {
        buffer._4_4_ = *(uint *)(inverse_DCT + 0xc);
      }
      else {
        buffer._4_4_ = *(uint *)(inverse_DCT + 0x20) % *(uint *)(inverse_DCT + 0xc);
        if (buffer._4_4_ == 0) {
          buffer._4_4_ = *(uint *)(inverse_DCT + 0xc);
        }
      }
      p_Var3 = cinfo->idct->inverse_DCT[block_rows];
      ppJStack_58 = output_buf[block_rows];
      for (local_38 = 0; local_38 < (int)buffer._4_4_; local_38 = local_38 + 1) {
        output_ptr = (JSAMPARRAY)ppaJVar7[local_38];
        compptr._4_4_ = 0;
        for (block_row = 0; (uint)block_row < *(uint *)(inverse_DCT + 0x1c);
            block_row = block_row + 1) {
          (*p_Var3)(cinfo,(jpeg_component_info *)inverse_DCT,(JCOEFPTR)output_ptr,ppJStack_58,
                    compptr._4_4_);
          output_ptr = output_ptr + 0x10;
          compptr._4_4_ = *(int *)(inverse_DCT + 0x24) + compptr._4_4_;
        }
        ppJStack_58 = ppJStack_58 + *(int *)(inverse_DCT + 0x28);
      }
    }
    inverse_DCT = inverse_DCT + 0x60;
  }
  uVar6 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar6;
  if (uVar6 < cinfo->total_iMCU_rows) {
    return 3;
  }
  return 4;
}

Assistant:

METHODDEF(int)
decompress_data (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num;
  int ci, block_row, block_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number < cinfo->output_scan_number ||
	 (cinfo->input_scan_number == cinfo->output_scan_number &&
	  cinfo->input_iMCU_row <= cinfo->output_iMCU_row)) {
    if ((*cinfo->inputctl->consume_input)(cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (! compptr->component_needed)
      continue;
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       cinfo->output_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row];
      output_col = 0;
      for (block_num = 0; block_num < compptr->width_in_blocks; block_num++) {
	(*inverse_DCT) (cinfo, compptr, (JCOEFPTR) buffer_ptr,
			output_ptr, output_col);
	buffer_ptr++;
	output_col += compptr->DCT_h_scaled_size;
      }
      output_ptr += compptr->DCT_v_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}